

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::ReferenceContext::copyTexSubImage1D
          (ReferenceContext *this,deUint32 target,int level,int xoffset,int x,int y,int width)

{
  Texture1D *pTVar1;
  pointer pTVar2;
  Texture1D *pTVar3;
  bool bVar4;
  PixelBufferAccess dst;
  MultisampleConstPixelBufferAccess local_90;
  ConstPixelBufferAccess local_68;
  
  pTVar2 = (this->m_textureUnits).
           super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
           ._M_impl.super__Vector_impl_data._M_start + this->m_activeTexture;
  getReadColorbuffer((MultisamplePixelBufferAccess *)&local_68,this);
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            (&local_90,(MultisamplePixelBufferAccess *)&local_68);
  if ((-1 < xoffset) && (-1 < width)) {
    if ((local_90.m_access.m_size.m_data[0] == 0) ||
       ((local_90.m_access.m_size.m_data[1] == 0 || (local_90.m_access.m_size.m_data[2] == 0)))) {
      if (this->m_lastError != 0) {
        return;
      }
      this->m_lastError = 0x502;
      return;
    }
    if (target != 0xde0) {
      if (this->m_lastError != 0) {
        return;
      }
      this->m_lastError = 0x500;
      return;
    }
    pTVar1 = pTVar2->tex1DBinding;
    pTVar3 = &pTVar2->default1DTex;
    if (pTVar1 != (Texture1D *)0x0) {
      pTVar3 = pTVar1;
    }
    if ((((uint)level < 0xe) &&
        (*(long *)((long)((pTVar3->m_levels).m_data + (uint)level) + 8) != 0)) &&
       (tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  (&local_68,&(pTVar3->m_levels).m_access[(uint)level].super_ConstPixelBufferAccess)
       , width + xoffset <= local_68.m_size.m_data[0])) {
      while (bVar4 = width != 0, width = width + -1, bVar4) {
        if ((-1 < x) && (x < local_90.m_access.m_size.m_data[1])) {
          rr::resolveMultisamplePixel
                    ((MultisampleConstPixelBufferAccess *)&stack0xffffffffffffffc0,(int)&local_90,x)
          ;
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)&local_68,(Vec4 *)&stack0xffffffffffffffc0,xoffset,0,0);
        }
        x = x + 1;
        xoffset = xoffset + 1;
      }
      return;
    }
  }
  if (this->m_lastError == 0) {
    this->m_lastError = 0x501;
  }
  return;
}

Assistant:

void ReferenceContext::copyTexSubImage1D (deUint32 target, int level, int xoffset, int x, int y, int width)
{
	TextureUnit&							unit	= m_textureUnits[m_activeTexture];
	rr::MultisampleConstPixelBufferAccess	src		= getReadColorbuffer();

	RC_IF_ERROR(xoffset < 0,	GL_INVALID_VALUE,		RC_RET_VOID);
	RC_IF_ERROR(width < 0,		GL_INVALID_VALUE,		RC_RET_VOID);
	RC_IF_ERROR(isEmpty(src),	GL_INVALID_OPERATION,	RC_RET_VOID);

	if (target == GL_TEXTURE_1D)
	{
		Texture1D& texture = unit.tex1DBinding ? *unit.tex1DBinding : unit.default1DTex;

		RC_IF_ERROR(!texture.hasLevel(level), GL_INVALID_VALUE, RC_RET_VOID);

		PixelBufferAccess dst = texture.getLevel(level);

		RC_IF_ERROR(xoffset + width > dst.getWidth(), GL_INVALID_VALUE, RC_RET_VOID);

		for (int xo = 0; xo < width; xo++)
		{
			if (!de::inBounds(x+xo, 0, src.raw().getHeight()))
				continue;

			dst.setPixel(rr::resolveMultisamplePixel(src, x+xo, y), xo+xoffset, 0);
		}
	}
	else
		RC_ERROR_RET(GL_INVALID_ENUM, RC_RET_VOID);
}